

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.c
# Opt level: O0

void take_gen(void *args0)

{
  int iVar1;
  _Bool _Var2;
  byte local_21;
  Value local_20;
  Value v;
  TakeGenArgs *args;
  void *args0_local;
  
  v.ptr = args0;
  args = (TakeGenArgs *)args0;
  while( true ) {
    iVar1 = *(int *)(v.u64 + 8);
    *(int *)(v.u64 + 8) = iVar1 + -1;
    local_21 = 0;
    if (0 < iVar1) {
      _Var2 = gen_should_finish();
      local_21 = _Var2 ^ 0xff;
    }
    if (((local_21 & 1) == 0) || (_Var2 = gen_next(*v.ptr,&local_20), !_Var2)) break;
    gen_yield(&local_20);
  }
  gen_close(*v.ptr);
  return;
}

Assistant:

static void
take_gen(void *args0)
{
    TakeGenArgs *args = (TakeGenArgs *) args0;
    while (args->n-- > 0 && !gen_should_finish()) {
        Value v;
        if (!gen_next(args->source, &v))
            break;
        gen_yield(&v);
    }
    gen_close(args->source);
}